

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_create_central_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint16 comment_size,mz_uint64 uncomp_size,mz_uint64 comp_size,
                  mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,mz_uint16 dos_time,
                  mz_uint16 dos_date,mz_uint64 local_header_ofs,mz_uint32 ext_attributes)

{
  undefined1 uVar1;
  undefined2 in_CX;
  undefined2 in_DX;
  undefined1 *in_RSI;
  undefined2 in_R8W;
  ulong in_R9;
  ulong in_stack_00000008;
  undefined4 in_stack_00000010;
  short in_stack_00000018;
  undefined2 in_stack_00000020;
  undefined2 in_stack_00000028;
  undefined2 in_stack_00000030;
  undefined2 in_stack_00000040;
  undefined4 local_130;
  ulong local_120;
  undefined4 local_110;
  
  memset(in_RSI,0,0x2e);
  *in_RSI = 0x50;
  in_RSI[1] = 0x4b;
  in_RSI[2] = 1;
  in_RSI[3] = 2;
  uVar1 = 0;
  if (in_stack_00000018 != 0) {
    uVar1 = 0x14;
  }
  in_RSI[6] = uVar1;
  in_RSI[7] = 0;
  in_RSI[8] = (char)in_stack_00000020;
  in_RSI[9] = (char)((ushort)in_stack_00000020 >> 8);
  in_RSI[10] = (char)in_stack_00000018;
  in_RSI[0xb] = (char)((ushort)in_stack_00000018 >> 8);
  in_RSI[0xc] = (char)in_stack_00000028;
  in_RSI[0xd] = (char)((ushort)in_stack_00000028 >> 8);
  in_RSI[0xe] = (char)in_stack_00000030;
  in_RSI[0xf] = (char)((ushort)in_stack_00000030 >> 8);
  in_RSI[0x10] = (char)in_stack_00000010;
  in_RSI[0x11] = (char)((uint)in_stack_00000010 >> 8);
  in_RSI[0x12] = (char)((uint)in_stack_00000010 >> 0x10);
  in_RSI[0x13] = (char)((uint)in_stack_00000010 >> 0x18);
  if (in_stack_00000008 < 0xffffffff) {
    local_110 = (undefined4)in_stack_00000008;
  }
  else {
    local_110 = 0xffffffff;
  }
  in_RSI[0x14] = (char)local_110;
  in_RSI[0x15] = (char)((uint)local_110 >> 8);
  in_RSI[0x16] = (char)((uint)local_110 >> 0x10);
  in_RSI[0x17] = (char)((uint)local_110 >> 0x18);
  local_120 = in_R9;
  if (0xfffffffe < in_R9) {
    local_120 = 0xffffffff;
  }
  in_RSI[0x18] = (char)local_120;
  in_RSI[0x19] = (char)(local_120 >> 8);
  in_RSI[0x1a] = (char)(local_120 >> 0x10);
  in_RSI[0x1b] = (char)(local_120 >> 0x18);
  in_RSI[0x1c] = (char)in_DX;
  in_RSI[0x1d] = (char)((ushort)in_DX >> 8);
  in_RSI[0x1e] = (char)in_CX;
  in_RSI[0x1f] = (char)((ushort)in_CX >> 8);
  in_RSI[0x20] = (char)in_R8W;
  in_RSI[0x21] = (char)((ushort)in_R8W >> 8);
  in_RSI[0x26] = (char)in_stack_00000040;
  in_RSI[0x27] = (char)((ushort)in_stack_00000040 >> 8);
  *(mz_uint16 *)(in_RSI + 0x28) = comment_size;
  if (uncomp_size < 0xffffffff) {
    local_130 = (undefined4)uncomp_size;
  }
  else {
    local_130 = 0xffffffff;
  }
  in_RSI[0x2a] = (char)local_130;
  in_RSI[0x2b] = (char)((uint)local_130 >> 8);
  in_RSI[0x2c] = (char)((uint)local_130 >> 0x10);
  in_RSI[0x2d] = (char)((uint)local_130 >> 0x18);
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_central_dir_header(
    mz_zip_archive *pZip, mz_uint8 *pDst, mz_uint16 filename_size,
    mz_uint16 extra_size, mz_uint16 comment_size, mz_uint64 uncomp_size,
    mz_uint64 comp_size, mz_uint32 uncomp_crc32, mz_uint16 method,
    mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date,
    mz_uint64 local_header_ofs, mz_uint32 ext_attributes) {
  (void)pZip;
  memset(pDst, 0, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_SIG_OFS, MZ_ZIP_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_VERSION_NEEDED_OFS, method ? 20 : 0);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_BIT_FLAG_OFS, bit_flags);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_METHOD_OFS, method);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_TIME_OFS, dos_time);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_DATE_OFS, dos_date);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_CRC32_OFS, uncomp_crc32);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS,
                MZ_MIN(comp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS,
                MZ_MIN(uncomp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILENAME_LEN_OFS, filename_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_EXTRA_LEN_OFS, extra_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_COMMENT_LEN_OFS, comment_size);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS, ext_attributes);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                MZ_MIN(local_header_ofs, MZ_UINT32_MAX));
  return MZ_TRUE;
}